

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_strtable_lookup2(upb_strtable *t,char *key,size_t len,upb_value *v)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  upb_tabent *puVar4;
  
  uVar1 = _upb_Hash(key,len,0x479aa8);
  if ((t->t).count != 0) {
    uVar2 = uVar1 & (t->t).mask;
    puVar4 = (t->t).entries;
    if (puVar4[uVar2].key.num != 0) {
      puVar4 = puVar4 + uVar2;
      do {
        uVar2 = ((puVar4->key).str)->size;
        if ((uVar2 == len) &&
           ((uVar2 == 0 || (iVar3 = bcmp((puVar4->key).str + 1,key,len), iVar3 == 0)))) {
          if (v == (upb_value *)0x0) {
            return true;
          }
          v->val = (puVar4->val).val;
          return true;
        }
        puVar4 = puVar4->next;
      } while (puVar4 != (_upb_tabent *)0x0);
    }
  }
  return false;
}

Assistant:

bool upb_strtable_lookup2(const upb_strtable* t, const char* key, size_t len,
                          upb_value* v) {
  uint32_t hash = _upb_Hash_NoSeed(key, len);
  return lookup(&t->t, strkey2(key, len), v, hash, &streql);
}